

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint HuffmanTree_makeFromLengths2(HuffmanTree_conflict *tree)

{
  uint uVar1;
  uint *puVar2;
  void *ptr;
  void *ptr_00;
  uint local_2c;
  uint local_28;
  uint n;
  uint bits;
  uint error;
  uint *nextcode;
  uint *blcount;
  HuffmanTree_conflict *tree_local;
  
  n = 0;
  puVar2 = (uint *)lodepng_malloc((ulong)tree->numcodes << 2);
  tree->codes = puVar2;
  ptr = lodepng_malloc((ulong)(tree->maxbitlen + 1) << 2);
  ptr_00 = lodepng_malloc((ulong)(tree->maxbitlen + 1) << 2);
  if (((tree->codes == (uint *)0x0) || (ptr == (void *)0x0)) || (ptr_00 == (void *)0x0)) {
    n = 0x53;
  }
  if (n == 0) {
    for (local_2c = 0; local_2c != tree->maxbitlen + 1; local_2c = local_2c + 1) {
      *(undefined4 *)((long)ptr_00 + (ulong)local_2c * 4) = 0;
      *(undefined4 *)((long)ptr + (ulong)local_2c * 4) = 0;
    }
    for (local_28 = 0; local_28 != tree->numcodes; local_28 = local_28 + 1) {
      *(int *)((long)ptr + (ulong)tree->lengths[local_28] * 4) =
           *(int *)((long)ptr + (ulong)tree->lengths[local_28] * 4) + 1;
    }
    for (local_28 = 1; local_28 <= tree->maxbitlen; local_28 = local_28 + 1) {
      *(int *)((long)ptr_00 + (ulong)local_28 * 4) =
           (*(int *)((long)ptr_00 + (ulong)(local_28 - 1) * 4) +
           *(int *)((long)ptr + (ulong)(local_28 - 1) * 4)) * 2;
    }
    for (local_2c = 0; local_2c != tree->numcodes; local_2c = local_2c + 1) {
      if (tree->lengths[local_2c] != 0) {
        uVar1 = *(uint *)((long)ptr_00 + (ulong)tree->lengths[local_2c] * 4);
        *(uint *)((long)ptr_00 + (ulong)tree->lengths[local_2c] * 4) = uVar1 + 1;
        tree->codes[local_2c] = uVar1;
        tree->codes[local_2c] =
             (1 << ((byte)tree->lengths[local_2c] & 0x1f)) - 1U & tree->codes[local_2c];
      }
    }
  }
  lodepng_free(ptr);
  lodepng_free(ptr_00);
  if (n == 0) {
    n = HuffmanTree_makeTable(tree);
  }
  return n;
}

Assistant:

static unsigned HuffmanTree_makeFromLengths2(HuffmanTree* tree) {
  unsigned* blcount;
  unsigned* nextcode;
  unsigned error = 0;
  unsigned bits, n;

  tree->codes = (unsigned*)lodepng_malloc(tree->numcodes * sizeof(unsigned));
  blcount = (unsigned*)lodepng_malloc((tree->maxbitlen + 1) * sizeof(unsigned));
  nextcode = (unsigned*)lodepng_malloc((tree->maxbitlen + 1) * sizeof(unsigned));
  if(!tree->codes || !blcount || !nextcode) error = 83; /*alloc fail*/

  if(!error) {
    for(n = 0; n != tree->maxbitlen + 1; n++) blcount[n] = nextcode[n] = 0;
    /*step 1: count number of instances of each code length*/
    for(bits = 0; bits != tree->numcodes; ++bits) ++blcount[tree->lengths[bits]];
    /*step 2: generate the nextcode values*/
    for(bits = 1; bits <= tree->maxbitlen; ++bits) {
      nextcode[bits] = (nextcode[bits - 1] + blcount[bits - 1]) << 1u;
    }
    /*step 3: generate all the codes*/
    for(n = 0; n != tree->numcodes; ++n) {
      if(tree->lengths[n] != 0) {
        tree->codes[n] = nextcode[tree->lengths[n]]++;
        /*remove superfluous bits from the code*/
        tree->codes[n] &= ((1u << tree->lengths[n]) - 1u);
      }
    }
  }

  lodepng_free(blcount);
  lodepng_free(nextcode);

  if(!error) error = HuffmanTree_makeTable(tree);
  return error;
}